

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

void __thiscall
LargeGapGrayCode::computeMinGap
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths,
          int *minGap,int *minCount)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  int *minCount_local;
  int *minGap_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths_local;
  LargeGapGrayCode *this_local;
  
  *minGap = 999;
  it._M_node = (_Base_ptr)minCount;
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (runLengths);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (runLengths);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_30);
    if (ppVar2->first < *minGap) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_30);
      *minGap = ppVar2->first;
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_30);
      (it._M_node)->_M_color = ppVar2->second;
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_30);
  }
  return;
}

Assistant:

void LargeGapGrayCode::computeMinGap(const std::map<int, int>& runLengths, int& minGap, int& minCount)
{
	minGap = 999;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		if(it->first < minGap) {
			minGap = it->first;
			minCount = it->second;
		}
	}
}